

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void srclistRenumberCursors(Parse *pParse,int *aCsrMap,SrcList *pSrc,int iExcept)

{
  int iVar1;
  Select *pSVar2;
  int iVar3;
  SrcItem *pSVar4;
  
  if (0 < pSrc->nSrc) {
    pSVar4 = pSrc->a;
    iVar3 = 0;
    do {
      if (iVar3 != iExcept) {
        if ((((pSVar4->fg).field_0x1 & 0x80) == 0) || (aCsrMap[(long)pSVar4->iCursor + 1] == 0)) {
          iVar1 = pParse->nTab;
          pParse->nTab = iVar1 + 1;
          aCsrMap[(long)pSVar4->iCursor + 1] = iVar1;
        }
        pSVar4->iCursor = aCsrMap[(long)pSVar4->iCursor + 1];
        if (((pSVar4->fg).field_0x1 & 4) != 0) {
          for (pSVar2 = ((pSVar4->u4).pSubq)->pSelect; pSVar2 != (Select *)0x0;
              pSVar2 = pSVar2->pPrior) {
            srclistRenumberCursors(pParse,aCsrMap,pSVar2->pSrc,-1);
          }
        }
      }
      iVar3 = iVar3 + 1;
      pSVar4 = pSVar4 + 1;
    } while (iVar3 < pSrc->nSrc);
  }
  return;
}

Assistant:

static void srclistRenumberCursors(
  Parse *pParse,                  /* Parse context */
  int *aCsrMap,                   /* Array to store cursor mappings in */
  SrcList *pSrc,                  /* FROM clause to renumber */
  int iExcept                     /* FROM clause item to skip */
){
  int i;
  SrcItem *pItem;
  for(i=0, pItem=pSrc->a; i<pSrc->nSrc; i++, pItem++){
    if( i!=iExcept ){
      Select *p;
      assert( pItem->iCursor < aCsrMap[0] );
      if( !pItem->fg.isRecursive || aCsrMap[pItem->iCursor+1]==0 ){
        aCsrMap[pItem->iCursor+1] = pParse->nTab++;
      }
      pItem->iCursor = aCsrMap[pItem->iCursor+1];
      if( pItem->fg.isSubquery ){
        for(p=pItem->u4.pSubq->pSelect; p; p=p->pPrior){
          srclistRenumberCursors(pParse, aCsrMap, p->pSrc, -1);
        }
      }
    }
  }
}